

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::readyReadSlot(QHttpThreadDelegate *this)

{
  size_t __nbytes;
  bool bVar1;
  qint64 qVar2;
  QHttpNetworkReply *this_00;
  void *__buf;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHttpNetworkReply **)(this + 0x150);
  if ((this_00 != (QHttpNetworkReply *)0x0) && (*(long *)(this + 0x120) == 0)) {
    if (*(long *)(this + 0x38) == 0) {
      while (bVar1 = QHttpNetworkReply::readAnyAvailable(this_00), bVar1) {
        LOCK();
        **(int **)(this + 0x48) = **(int **)(this + 0x48) + 1;
        UNLOCK();
        QHttpNetworkReply::readAny((QByteArray *)&QStack_38,*(QHttpNetworkReply **)(this + 0x150));
        downloadData(this,(QByteArray *)&QStack_38);
        QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
        this_00 = *(QHttpNetworkReply **)(this + 0x150);
      }
    }
    else if (*(long *)(this + 0x40) < *(long *)(this + 0x38)) {
      __buf = (void *)0x0;
      while ((bVar1 = QHttpNetworkReply::readAnyAvailable(this_00), bVar1 &&
             ((long)__buf < *(long *)(this + 0x38) - *(long *)(this + 0x40)))) {
        qVar2 = QHttpNetworkReply::sizeNextBlock(*(QHttpNetworkReply **)(this + 0x150));
        __nbytes = *(size_t *)(this + 0x38);
        __buf = (void *)(__nbytes - *(long *)(this + 0x40));
        if ((long)__buf < qVar2) {
          *(size_t *)(this + 0x40) = __nbytes;
          LOCK();
          **(int **)(this + 0x48) = **(int **)(this + 0x48) + 1;
          UNLOCK();
          QHttpNetworkReply::read
                    ((QHttpNetworkReply *)&QStack_38,(int)*(undefined8 *)(this + 0x150),__buf,
                     __nbytes);
        }
        else {
          __buf = (void *)QHttpNetworkReply::sizeNextBlock(*(QHttpNetworkReply **)(this + 0x150));
          *(long *)(this + 0x40) = *(long *)(this + 0x40) + (long)__buf;
          LOCK();
          **(int **)(this + 0x48) = **(int **)(this + 0x48) + 1;
          UNLOCK();
          QHttpNetworkReply::readAny((QByteArray *)&QStack_38,*(QHttpNetworkReply **)(this + 0x150))
          ;
        }
        downloadData(this,(QByteArray *)&QStack_38);
        QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
        this_00 = *(QHttpNetworkReply **)(this + 0x150);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::readyReadSlot()
{
    if (!httpReply)
        return;

    // Don't do in zerocopy case
    if (!downloadBuffer.isNull())
        return;

    if (readBufferMaxSize) {
        if (bytesEmitted < readBufferMaxSize) {
            qint64 sizeEmitted = 0;
            while (httpReply->readAnyAvailable() && (sizeEmitted < (readBufferMaxSize-bytesEmitted))) {
                if (httpReply->sizeNextBlock() > (readBufferMaxSize-bytesEmitted)) {
                    sizeEmitted = readBufferMaxSize-bytesEmitted;
                    bytesEmitted += sizeEmitted;
                    pendingDownloadData->fetchAndAddRelease(1);
                    emit downloadData(httpReply->read(sizeEmitted));
                } else {
                    sizeEmitted = httpReply->sizeNextBlock();
                    bytesEmitted += sizeEmitted;
                    pendingDownloadData->fetchAndAddRelease(1);
                    emit downloadData(httpReply->readAny());
                }
            }
        } else {
            // We need to wait until we empty data from the read buffer in the reply.
        }

    } else {
        while (httpReply->readAnyAvailable()) {
            pendingDownloadData->fetchAndAddRelease(1);
            emit downloadData(httpReply->readAny());
        }
    }
}